

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<int,_1000> * __thiscall
TPZManVector<int,_1000>::operator=(TPZManVector<int,_1000> *this,TPZManVector<int,_1000> *copy)

{
  int *piVar1;
  long lVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this == copy) {
    return this;
  }
  uVar5 = (copy->super_TPZVec<int>).fNElements;
  lVar2 = (this->super_TPZVec<int>).fNAlloc;
  if ((lVar2 < (long)uVar5) &&
     (piVar3 = (this->super_TPZVec<int>).fStore, piVar3 != this->fExtAlloc && piVar3 != (int *)0x0))
  {
    operator_delete__(piVar3);
    (this->super_TPZVec<int>).fStore = (int *)0x0;
    (this->super_TPZVec<int>).fNAlloc = 0;
    lVar2 = 0;
  }
  if ((long)uVar5 < 0x3e9) {
    piVar1 = (this->super_TPZVec<int>).fStore;
    piVar3 = this->fExtAlloc;
    if (piVar1 != (int *)0x0 && piVar1 != piVar3) {
      operator_delete__(piVar1);
    }
    (this->super_TPZVec<int>).fNAlloc = 0;
    (this->super_TPZVec<int>).fStore = piVar3;
  }
  else {
    if ((long)uVar5 <= lVar2) {
      (this->super_TPZVec<int>).fNElements = uVar5;
      piVar3 = (this->super_TPZVec<int>).fStore;
      goto LAB_0116a5ab;
    }
    piVar3 = (int *)operator_new__(-(ulong)(uVar5 >> 0x3e != 0) | uVar5 * 4);
    (this->super_TPZVec<int>).fStore = piVar3;
    (this->super_TPZVec<int>).fNAlloc = uVar5;
  }
  (this->super_TPZVec<int>).fNElements = uVar5;
LAB_0116a5ab:
  piVar1 = (copy->super_TPZVec<int>).fStore;
  uVar4 = 0;
  if ((long)uVar5 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    piVar3[uVar4] = piVar1[uVar4];
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}